

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::anon_unknown_0::TessellationExecutor::TessellationExecutor
          (TessellationExecutor *this,Context *context,ShaderSpec *shaderSpec,
          VkDescriptorSetLayout extraResourcesLayout)

{
  VkPhysicalDeviceFeatures *pVVar1;
  NotSupportedError *this_00;
  
  BufferIoExecutor::BufferIoExecutor(&this->super_BufferIoExecutor,context,shaderSpec);
  (this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor =
       (_func_int **)&PTR__BufferIoExecutor_00d04328;
  (this->m_extraResourcesLayout).m_internal = extraResourcesLayout.m_internal;
  pVVar1 = Context::getDeviceFeatures(context);
  if (pVVar1->tessellationShader != 0) {
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Tessellation shader is not supported by device",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
             ,0x852);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TessellationExecutor::TessellationExecutor (Context& context, const ShaderSpec& shaderSpec, VkDescriptorSetLayout extraResourcesLayout)
	: BufferIoExecutor			(context, shaderSpec)
	, m_extraResourcesLayout	(extraResourcesLayout)
{
	const VkPhysicalDeviceFeatures& features = context.getDeviceFeatures();

	if (!features.tessellationShader)
		TCU_THROW(NotSupportedError, "Tessellation shader is not supported by device");
}